

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSet.cpp
# Opt level: O1

int __thiscall Js::JavascriptSet::Size(JavascriptSet *this)

{
  bool bVar1;
  ThreadContext *pTVar2;
  code *pcVar3;
  bool bVar4;
  BVIndex BVar5;
  undefined4 *puVar6;
  uint uVar7;
  long *plVar8;
  
  pTVar2 = ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr
             )->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
  bVar1 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  uVar7 = (uint)this->kind;
  switch(this->kind) {
  case EmptySet:
    goto switchD_00d1b94a_caseD_0;
  case IntSet:
    plVar8 = *(long **)this->u;
    if (plVar8 != (long *)0x0) {
      uVar7 = 0;
      do {
        BVar5 = BVUnitT<unsigned_long>::CountBit(plVar8[2]);
        uVar7 = uVar7 + BVar5;
        plVar8 = (long *)*plVar8;
      } while (plVar8 != (long *)0x0);
      goto switchD_00d1b94a_caseD_0;
    }
    break;
  case SimpleVarSet:
  case ComplexVarSet:
    uVar7 = *(int *)((this->u).field3 + 0x20) - *(int *)((this->u).field3 + 0x28);
    goto switchD_00d1b94a_caseD_0;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
                                ,0x265,"((0))","(0)");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  uVar7 = 0;
switchD_00d1b94a_caseD_0:
  pTVar2->noJsReentrancy = bVar1;
  return uVar7;
}

Assistant:

int JavascriptSet::Size()
{
    JS_REENTRANCY_LOCK(jsReentLock, this->GetScriptContext()->GetThreadContext());
    switch (this->kind)
    {
    case SetKind::EmptySet:
        return 0;
    case SetKind::IntSet:
        return this->u.intSet->Count();
    case SetKind::SimpleVarSet:
        return this->u.simpleVarSet->Count();
    case SetKind::ComplexVarSet:
        return this->u.complexVarSet->Count();
    default:
        Assume(UNREACHED);
        return 0;
    }
}